

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  Filter *pFVar1;
  bool bVar2;
  Filter *this_00;
  long lVar3;
  Filter *pFVar4;
  
  this_00 = (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = ((long)pFVar1 - (long)this_00 >> 3) * -0x5555555555555555 >> 2;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = Filter::matches(this_00,testCase);
      pFVar4 = this_00;
      if (bVar2) goto LAB_00127e55;
      bVar2 = Filter::matches(this_00 + 1,testCase);
      pFVar4 = this_00 + 1;
      if (bVar2) goto LAB_00127e55;
      bVar2 = Filter::matches(this_00 + 2,testCase);
      pFVar4 = this_00 + 2;
      if (bVar2) goto LAB_00127e55;
      bVar2 = Filter::matches(this_00 + 3,testCase);
      pFVar4 = this_00 + 3;
      if (bVar2) goto LAB_00127e55;
      this_00 = this_00 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pFVar1 - (long)this_00 >> 3) * -0x5555555555555555;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pFVar4 = pFVar1;
      if ((lVar3 != 3) || (bVar2 = Filter::matches(this_00,testCase), pFVar4 = this_00, bVar2))
      goto LAB_00127e55;
      this_00 = this_00 + 1;
    }
    bVar2 = Filter::matches(this_00,testCase);
    pFVar4 = this_00;
    if (bVar2) goto LAB_00127e55;
    this_00 = this_00 + 1;
  }
  bVar2 = Filter::matches(this_00,testCase);
  pFVar4 = this_00;
  if (!bVar2) {
    pFVar4 = pFVar1;
  }
LAB_00127e55:
  return pFVar4 != pFVar1;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        return std::any_of( m_filters.begin(), m_filters.end(), [&]( Filter const& f ){ return f.matches( testCase ); } );
    }